

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivFilterTest(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vPoIds_00;
  int local_1c;
  int i;
  Vec_Int_t *vPoIds;
  Gia_Man_t *p_local;
  
  vPoIds_00 = Vec_IntAlloc(1000);
  for (local_1c = 0; local_1c < 10; local_1c = local_1c + 1) {
    iVar1 = Gia_ManPoNum(p);
    Vec_IntPush(vPoIds_00,iVar1 + local_1c * 2 + 2);
    iVar1 = Gia_ManPoNum(p);
    printf("%d ",(ulong)(iVar1 + local_1c * 2 + 2));
  }
  printf("\n");
  Gia_ManEquivFilter(p,vPoIds_00,1);
  Vec_IntFree(vPoIds_00);
  return;
}

Assistant:

void Gia_ManEquivFilterTest( Gia_Man_t * p )
{
    Vec_Int_t * vPoIds;
    int i;
    vPoIds = Vec_IntAlloc( 1000 );
    for ( i = 0; i < 10; i++ )
    {
        Vec_IntPush( vPoIds, Gia_ManPoNum(p) + 2 * i + 2 );
        printf( "%d ", Gia_ManPoNum(p) + 2*i + 2 );
    }
    printf( "\n" );
    Gia_ManEquivFilter( p, vPoIds, 1 );
    Vec_IntFree( vPoIds );
}